

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trust_store_in_memory_unittest.cc
# Opt level: O1

void __thiscall bssl::anon_unknown_0::TrustStoreInMemoryTest::SetUp(TrustStoreInMemoryTest *this)

{
  bool bVar1;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *pcVar2;
  char *in_R9;
  pointer *__ptr;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  ParsedCertificateList chain;
  AssertHelper local_78;
  AssertHelper local_70;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  undefined1 local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  ParsedCertificateList local_38;
  
  local_38.
  super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.
  super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58 = (undefined1  [8])&local_48;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,
             "testdata/verify_certificate_chain_unittest/key-rollover/oldchain.pem","");
  bVar1 = ReadCertChainFromFile((string *)local_58,&local_38);
  local_68._M_head_impl._0_1_ = (internal)bVar1;
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_58 != (undefined1  [8])&local_48) {
    operator_delete((void *)local_58,local_48._M_allocated_capacity + 1);
  }
  if (local_68._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_58,(internal *)&local_68,
               (AssertionResult *)
               "ReadCertChainFromFile( \"testdata/verify_certificate_chain_unittest/key-rollover/oldchain.pem\", &chain)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/trust_store_in_memory_unittest.cc"
               ,0x1d,(char *)local_58);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
    goto LAB_003c0d27;
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    ::std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  local_78.data_._0_4_ = 3;
  local_68._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)local_38.
              super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_38.
              super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 4);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_58,"3U","chain.size()",(uint *)&local_78,(unsigned_long *)&local_68);
  if (local_58[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/trust_store_in_memory_unittest.cc"
               ,0x1f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_68);
LAB_003c0e16:
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_68._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_68._M_head_impl + 8))();
    }
    if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_003c0e42;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_50;
  }
  else {
    if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      ::std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_50,local_50);
    }
    (this->target_).super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = ((local_38.
               super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->target_).
                super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,
               &((local_38.
                  super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount);
    (this->oldintermediate_).
    super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_38.
         super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
         ._M_impl.super__Vector_impl_data._M_start[1].
         super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->oldintermediate_).
                super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,
               &local_38.
                super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                ._M_impl.super__Vector_impl_data._M_start[1].
                super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    (this->oldroot_).super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = local_38.
             super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
             ._M_impl.super__Vector_impl_data._M_start[2].
             super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->oldroot_).
                super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,
               &local_38.
                super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                ._M_impl.super__Vector_impl_data._M_start[2].
                super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    bVar1 = (this->target_).
            super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0;
    local_68._M_head_impl._0_1_ = (internal)!bVar1;
    local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar1) {
      testing::Message::Message((Message *)&local_78);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_58,(internal *)&local_68,(AssertionResult *)"target_","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/trust_store_in_memory_unittest.cc"
                 ,0x23,(char *)local_58);
      testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
LAB_003c0d27:
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      if (local_58 != (undefined1  [8])&local_48) {
        operator_delete((void *)local_58,local_48._M_allocated_capacity + 1);
      }
      if ((long *)CONCAT44(local_78.data_._4_4_,local_78.data_._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_78.data_._4_4_,local_78.data_._0_4_) + 8))();
      }
    }
    else {
      bVar1 = (this->oldintermediate_).
              super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              == (element_type *)0x0;
      local_68._M_head_impl._0_1_ = (internal)!bVar1;
      local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (bVar1) {
        testing::Message::Message((Message *)&local_78);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_58,(internal *)&local_68,(AssertionResult *)"oldintermediate_",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_70,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/trust_store_in_memory_unittest.cc"
                   ,0x24,(char *)local_58);
        testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
        goto LAB_003c0d27;
      }
      bVar1 = (this->oldroot_).
              super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              == (element_type *)0x0;
      local_68._M_head_impl._0_1_ = (internal)!bVar1;
      local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (bVar1) {
        testing::Message::Message((Message *)&local_78);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_58,(internal *)&local_68,(AssertionResult *)"oldroot_","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_70,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/trust_store_in_memory_unittest.cc"
                   ,0x25,(char *)local_58);
        testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
        goto LAB_003c0d27;
      }
      local_58 = (undefined1  [8])&local_48;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_58,
                 "testdata/verify_certificate_chain_unittest/key-rollover/longrolloverchain.pem","")
      ;
      bVar1 = ReadCertChainFromFile((string *)local_58,&local_38);
      local_68._M_head_impl._0_1_ = (internal)bVar1;
      local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_58 != (undefined1  [8])&local_48) {
        operator_delete((void *)local_58,local_48._M_allocated_capacity + 1);
      }
      if (local_68._M_head_impl._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_78);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_58,(internal *)&local_68,
                   (AssertionResult *)
                   "ReadCertChainFromFile(\"testdata/verify_certificate_chain_unittest/\" \"key-rollover/longrolloverchain.pem\", &chain)"
                   ,"false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_70,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/trust_store_in_memory_unittest.cc"
                   ,0x2a,(char *)local_58);
        testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
        goto LAB_003c0d27;
      }
      if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        ::std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_60,local_60);
      }
      local_78.data_._0_4_ = 5;
      local_68._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)local_38.
                  super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_38.
                  super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                ((internal *)local_58,"5U","chain.size()",(uint *)&local_78,
                 (unsigned_long *)&local_68);
      if (local_58[0] == (string)0x0) {
        testing::Message::Message((Message *)&local_68);
        if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = (local_50->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_78,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/trust_store_in_memory_unittest.cc"
                   ,0x2c,pcVar2);
        testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_68);
        goto LAB_003c0e16;
      }
      if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        ::std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_50,local_50);
      }
      (this->newintermediate_).
      super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_38.
           super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->newintermediate_).
                  super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,
                 &local_38.
                  super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[1].
                  super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      (this->newroot_).super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = local_38.
                super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                ._M_impl.super__Vector_impl_data._M_start[2].
                super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->newroot_).
                  super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,
                 &local_38.
                  super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[2].
                  super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      (this->newrootrollover_).
      super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_38.
           super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
           ._M_impl.super__Vector_impl_data._M_start[3].
           super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->newrootrollover_).
                  super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,
                 &local_38.
                  super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[3].
                  super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      bVar1 = (this->newintermediate_).
              super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              == (element_type *)0x0;
      local_68._M_head_impl._0_1_ = (internal)!bVar1;
      local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (bVar1) {
        testing::Message::Message((Message *)&local_78);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_58,(internal *)&local_68,(AssertionResult *)"newintermediate_",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_70,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/trust_store_in_memory_unittest.cc"
                   ,0x30,(char *)local_58);
        testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
        goto LAB_003c0d27;
      }
      bVar1 = (this->newroot_).
              super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              == (element_type *)0x0;
      local_68._M_head_impl._0_1_ = (internal)!bVar1;
      local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (bVar1) {
        testing::Message::Message((Message *)&local_78);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_58,(internal *)&local_68,(AssertionResult *)"newroot_","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_70,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/trust_store_in_memory_unittest.cc"
                   ,0x31,(char *)local_58);
        testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
        goto LAB_003c0d27;
      }
      local_68._M_head_impl._0_1_ =
           (internal)
           ((this->newrootrollover_).
            super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
           (element_type *)0x0);
      local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!(bool)local_68._M_head_impl._0_1_) {
        testing::Message::Message((Message *)&local_78);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_58,(internal *)&local_68,(AssertionResult *)"newrootrollover_",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_70,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/trust_store_in_memory_unittest.cc"
                   ,0x32,(char *)local_58);
        testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
        goto LAB_003c0d27;
      }
    }
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_60;
    local_50 = local_60;
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_003c0e42;
  }
  ::std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,local_50);
LAB_003c0e42:
  ::std::
  vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
  ::~vector(&local_38);
  return;
}

Assistant:

void SetUp() override {
    ParsedCertificateList chain;
    ASSERT_TRUE(ReadCertChainFromFile(
        "testdata/verify_certificate_chain_unittest/key-rollover/oldchain.pem",
        &chain));

    ASSERT_EQ(3U, chain.size());
    target_ = chain[0];
    oldintermediate_ = chain[1];
    oldroot_ = chain[2];
    ASSERT_TRUE(target_);
    ASSERT_TRUE(oldintermediate_);
    ASSERT_TRUE(oldroot_);

    ASSERT_TRUE(
        ReadCertChainFromFile("testdata/verify_certificate_chain_unittest/"
                              "key-rollover/longrolloverchain.pem",
                              &chain));

    ASSERT_EQ(5U, chain.size());
    newintermediate_ = chain[1];
    newroot_ = chain[2];
    newrootrollover_ = chain[3];
    ASSERT_TRUE(newintermediate_);
    ASSERT_TRUE(newroot_);
    ASSERT_TRUE(newrootrollover_);
  }